

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O2

void __thiscall
Minisat::OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll
          (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this)

{
  long lVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar1 = *(long *)(this + 0x20), lVar3 < *(int *)(this + 0x28); lVar3 = lVar3 + 1)
  {
    if (*(char *)(*(long *)(this + 0x10) + (long)*(int *)(lVar1 + lVar2)) != '\0') {
      clean(this,(Lit *)(lVar1 + lVar2));
    }
    lVar2 = lVar2 + 4;
  }
  if (lVar1 != 0) {
    *(undefined4 *)(this + 0x28) = 0;
  }
  return;
}

Assistant:

void OccLists<Idx, Vec, Deleted>::cleanAll()
{
    for (int i = 0; i < dirties.size(); i++)
        // Dirties may contain duplicates so check here if a variable is already cleaned:
        if (dirty[toInt(dirties[i])]) clean(dirties[i]);
    dirties.clear();
}